

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_call_bound_function
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  int iVar1;
  long lVar2;
  int iVar3;
  BOOL BVar4;
  long lVar5;
  int64_t aiStackY_90 [2];
  undefined4 in_stack_ffffffffffffff88;
  int i;
  int arg_count;
  JSValue new_target;
  JSValue *arg_buf;
  JSBoundFunction *bf;
  JSObject *p;
  JSContext *pJStack_40;
  int argc_local;
  JSContext *ctx_local;
  JSValue this_obj_local;
  JSValue func_obj_local;
  undefined8 local_10;
  
  this_obj_local.u = (JSValueUnion)this_obj.tag;
  ctx_local = (JSContext *)this_obj.u;
  bf = (JSBoundFunction *)func_obj.u;
  arg_buf = *(JSValue **)((long)bf + 0x30);
  iVar3 = arg_buf[2].u.int32 + argc;
  p._4_4_ = argc;
  pJStack_40 = ctx;
  this_obj_local.tag = (int64_t)bf;
  BVar4 = js_check_stack_overflow((JSRuntime *)_i,CONCAT44(iVar3,in_stack_ffffffffffffff88));
  if (BVar4 == 0) {
    lVar5 = (long)iVar3;
    lVar2 = lVar5 * -0x10;
    new_target.tag = (int64_t)(&stack0xffffffffffffff88 + lVar2);
    for (iVar3 = 0; iVar3 < arg_buf[2].u.int32; iVar3 = iVar3 + 1) {
      *(int64_t *)(new_target.tag + (long)iVar3 * 0x10) = arg_buf[(long)iVar3 + 2].tag;
      ((int64_t *)(new_target.tag + (long)iVar3 * 0x10))[1] = (&arg_buf[(long)iVar3 + 2].tag)[1];
    }
    for (iVar3 = 0; iVar3 < p._4_4_; iVar3 = iVar3 + 1) {
      iVar1 = arg_buf[2].u.int32;
      *(JSValueUnion *)(new_target.tag + (long)(iVar1 + iVar3) * 0x10) = argv[iVar3].u;
      ((JSValueUnion *)(new_target.tag + (long)(iVar1 + iVar3) * 0x10))[1] =
           (JSValueUnion)argv[iVar3].tag;
    }
    if ((flags & 1U) == 0) {
      aiStackY_90[lVar5 * -2 + 1] = new_target.tag;
      aiStackY_90[lVar5 * -2] = 0x11d470;
      join_0x00000010_0x00000000_ =
           JS_Call((JSContext *)(&bf)[lVar5 * -2],*(JSValue *)(&ctx_local + lVar5 * -2),
                   *(JSValue *)(&p + lVar5 * -2),*(int *)((long)&arg_buf + lVar2 + 4),
                   (JSValue *)(&local_10)[lVar5 * -2]);
    }
    else {
      _i = ctx_local;
      new_target.u = this_obj_local.u;
      *(undefined8 *)(&stack0xffffffffffffff80 + lVar2) = 0x11d3ee;
      BVar4 = js_same_value((JSContext *)(&bf)[lVar5 * -2],*(JSValue *)(&ctx_local + lVar5 * -2),
                            *(JSValue *)(&p + lVar5 * -2));
      if (BVar4 != 0) {
        _i = arg_buf->u;
        new_target.u = (JSValueUnion)arg_buf->tag;
      }
      aiStackY_90[lVar5 * -2 + 1] = new_target.tag;
      aiStackY_90[lVar5 * -2] = 0x11d432;
      join_0x00000010_0x00000000_ =
           JS_CallConstructor2(*(JSContext **)(&i + lVar5 * -4),*(JSValue *)(&arg_buf + lVar5 * -2),
                               (&new_target)[-lVar5],*(int *)(&stack0xffffffffffffff8c + lVar2),
                               (JSValue *)(&this_obj_local)[-lVar5].u.ptr);
    }
  }
  else {
    join_0x00000010_0x00000000_ = JS_ThrowStackOverflow((JSContext *)0x11d2fb);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static JSValue js_call_bound_function(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst this_obj,
                                      int argc, JSValueConst *argv, int flags)
{
    JSObject *p;
    JSBoundFunction *bf;
    JSValueConst *arg_buf, new_target;
    int arg_count, i;

    p = JS_VALUE_GET_OBJ(func_obj);
    bf = p->u.bound_function;
    arg_count = bf->argc + argc;
    if (js_check_stack_overflow(ctx->rt, sizeof(JSValue) * arg_count))
        return JS_ThrowStackOverflow(ctx);
    arg_buf = alloca(sizeof(JSValue) * arg_count);
    for(i = 0; i < bf->argc; i++) {
        arg_buf[i] = bf->argv[i];
    }
    for(i = 0; i < argc; i++) {
        arg_buf[bf->argc + i] = argv[i];
    }
    if (flags & JS_CALL_FLAG_CONSTRUCTOR) {
        new_target = this_obj;
        if (js_same_value(ctx, func_obj, new_target))
            new_target = bf->func_obj;
        return JS_CallConstructor2(ctx, bf->func_obj, new_target,
                                   arg_count, arg_buf);
    } else {
        return JS_Call(ctx, bf->func_obj, bf->this_val,
                       arg_count, arg_buf);
    }
}